

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_token.cpp
# Opt level: O3

void __thiscall
CNetTokenCache::AddToken(CNetTokenCache *this,NETADDR *pAddr,TOKEN Token,int TokenFLag)

{
  CNetBase *this_00;
  undefined4 uVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  int iVar9;
  TOKEN ResponseToken;
  CConnlessPacketInfo *pCVar10;
  int64 iVar11;
  int64 iVar12;
  undefined8 *puVar13;
  CConnlessPacketInfo *pCVar14;
  CConnlessPacketInfo *pCVar15;
  CConnlessPacketInfo *a;
  long in_FS_OFFSET;
  NETADDR local_58;
  long local_38;
  undefined4 uVar3;
  undefined3 uVar5;
  undefined2 uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (Token != 0xffffffff) {
    if (this->m_pConnlessPacketList != (CConnlessPacketInfo *)0x0) {
      pCVar14 = (CConnlessPacketInfo *)0x0;
      a = this->m_pConnlessPacketList;
      do {
        local_58.ip[0] = '\0';
        local_58.ip[1] = '\0';
        local_58.ip[2] = '\0';
        local_58.ip[3] = '\0';
        local_58.ip[4] = '\0';
        local_58.ip[5] = '\0';
        local_58.ip[6] = '\0';
        local_58.ip[7] = '\0';
        local_58.ip[8] = '\0';
        local_58.ip[9] = '\0';
        local_58.ip[10] = '\0';
        local_58.ip[0xb] = '\0';
        local_58.ip[0xc] = '\0';
        local_58.ip[0xd] = '\0';
        local_58.ip[0xe] = '\0';
        local_58.ip[0xf] = '\0';
        local_58.port = 0;
        local_58.reserved = 0;
        local_58.type = 7;
        iVar9 = net_addr_comp(&a->m_Addr,pAddr,1);
        if (iVar9 == 0) {
LAB_0013c062:
          if (a->m_pfnCallback != (FSendCallback)0x0) {
            (*a->m_pfnCallback)(a->m_TrackID,a->m_pCallbackUser);
          }
          this_00 = this->m_pNetBase;
          ResponseToken = CNetTokenManager::GenerateToken(pAddr,this->m_pTokenManager->m_Seed);
          CNetBase::SendPacketConnless
                    (this_00,&a->m_Addr,Token,ResponseToken,a->m_aData,a->m_DataSize);
          pCVar15 = a->m_pNext;
          if (pCVar14 != (CConnlessPacketInfo *)0x0) {
            pCVar14->m_pNext = pCVar15;
          }
          if (a == this->m_pConnlessPacketList) {
            this->m_pConnlessPacketList = pCVar15;
          }
          operator_delete(a,0x5c0);
        }
        else {
          if ((TokenFLag & 1U) != 0) {
            iVar9 = net_addr_comp(&a->m_Addr,&local_58,0);
            if (iVar9 == 0) goto LAB_0013c062;
          }
          pCVar10 = a;
          if (pCVar14 != (CConnlessPacketInfo *)0x0) {
            pCVar10 = pCVar14->m_pNext;
          }
          pCVar15 = a->m_pNext;
          pCVar14 = pCVar10;
        }
        a = pCVar15;
      } while (pCVar15 != (CConnlessPacketInfo *)0x0);
    }
    if ((TokenFLag & 2U) == 0) {
      local_58.ip._12_4_ = SUB84(*(undefined8 *)(pAddr->ip + 0xc),0);
      local_58._20_4_ = SUB84((ulong)*(undefined8 *)(pAddr->ip + 0xc) >> 0x20,0);
      uVar1 = pAddr->type;
      uVar2 = pAddr->ip[0];
      uVar4 = pAddr->ip[1];
      uVar6 = pAddr->ip[2];
      uVar8 = pAddr->ip[3];
      uVar7 = CONCAT11(uVar8,uVar6);
      uVar5 = CONCAT21(uVar7,uVar4);
      uVar3 = CONCAT31(uVar5,uVar2);
      local_58.ip._4_4_ = SUB84(*(undefined8 *)(pAddr->ip + 4),0);
      local_58.ip._8_4_ = SUB84((ulong)*(undefined8 *)(pAddr->ip + 4) >> 0x20,0);
      local_58.type = uVar1;
      local_58.ip._0_4_ = uVar3;
      iVar11 = time_get();
      iVar12 = time_freq();
      puVar13 = (undefined8 *)CRingBufferBase::Allocate((CRingBufferBase *)this,0x28);
      *puVar13 = CONCAT44(local_58.ip._0_4_,local_58.type);
      puVar13[1] = CONCAT44(local_58.ip._8_4_,local_58.ip._4_4_);
      puVar13[2] = CONCAT44(local_58._20_4_,local_58.ip._12_4_);
      *(TOKEN *)(puVar13 + 3) = Token;
      puVar13[4] = iVar12 * 0x10 + iVar11;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetTokenCache::AddToken(const NETADDR *pAddr, TOKEN Token, int TokenFLag)
{
	if(Token == NET_TOKEN_NONE)
		return;

	// search the list of packets to be sent
	// for this address
	CConnlessPacketInfo *pPrevInfo = 0;
	CConnlessPacketInfo *pInfo = m_pConnlessPacketList;
	bool Found = false;
	while(pInfo)
	{
		NETADDR NullAddr = { 0 };
		NullAddr.type = 7;	// cover broadcasts
		if(net_addr_comp(&pInfo->m_Addr, pAddr, true) == 0 || ((TokenFLag&NET_TOKENFLAG_ALLOWBROADCAST) && net_addr_comp(&pInfo->m_Addr, &NullAddr, false) == 0))
		{
			// notify the user that the packet gets delivered
			if(pInfo->m_pfnCallback)
				pInfo->m_pfnCallback(pInfo->m_TrackID, pInfo->m_pCallbackUser);
			m_pNetBase->SendPacketConnless(&(pInfo->m_Addr), Token, m_pTokenManager->GenerateToken(pAddr), pInfo->m_aData, pInfo->m_DataSize);
			CConnlessPacketInfo *pNext = pInfo->m_pNext;
			if(pPrevInfo)
				pPrevInfo->m_pNext = pNext;
			if(pInfo == m_pConnlessPacketList)
				m_pConnlessPacketList = pNext;
			delete pInfo;
			pInfo = pNext;
		}
		else
		{
			if(pPrevInfo)
				pPrevInfo = pPrevInfo->m_pNext;
			else
				pPrevInfo = pInfo;
			pInfo = pInfo->m_pNext;
		}
	}

	// add the token
	if(Found || !(TokenFLag&NET_TOKENFLAG_RESPONSEONLY))
	{
		CAddressInfo Info;
		Info.m_Addr = *pAddr;
		Info.m_Token = Token;
		Info.m_Expiry = time_get() + time_freq() * NET_TOKENCACHE_ADDRESSEXPIRY;
		(*m_TokenCache.Allocate(sizeof(Info))) = Info;
	}
}